

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,TextureTestBase *this,GLuint param_1,
          ProgramInterface *program_interface,STAGES stage)

{
  size_type sVar1;
  ulong uVar2;
  reference ppVVar3;
  GLchar *pGVar4;
  allocator<char> local_189;
  string local_188;
  string local_168;
  string *local_148;
  string *var_verification_2;
  Variable *var_2;
  GLuint i_2;
  string local_110;
  string *local_f0;
  string *var_verification_1;
  Variable *var_1;
  GLuint i_1;
  string local_b8;
  string *local_98;
  string *var_verification;
  Variable *var;
  size_t sStack_80;
  GLuint i;
  size_t position;
  ShaderInterface *local_70;
  ShaderInterface *si;
  FLAVOUR in_flavour;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string verification;
  STAGES stage_local;
  ProgramInterface *program_interface_local;
  GLuint param_2_local;
  TextureTestBase *this_local;
  
  verification.field_2._12_4_ = stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"if (LIST)\n    {\n        result = 0u;\n    }\n",&local_51);
  std::allocator<char>::~allocator(&local_51);
  si._0_4_ = Utils::Variable::GetFlavour(verification.field_2._12_4_,INPUT);
  local_70 = Utils::ProgramInterface::GetShaderInterface
                       (program_interface,verification.field_2._12_4_);
  sVar1 = std::
          vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
          ::size(&local_70->m_inputs);
  if (sVar1 == 0) {
    sVar1 = std::
            vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ::size(&local_70->m_uniforms);
    if (sVar1 == 0) {
      sVar1 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::size(&local_70->m_ssb_blocks);
      if (sVar1 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&position + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&position + 7));
        goto LAB_00e6ae74;
      }
    }
  }
  sStack_80 = 0;
  var._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)var._4_4_;
    sVar1 = std::
            vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ::size(&local_70->m_inputs);
    if (sVar1 <= uVar2) break;
    ppVVar3 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::operator[](&local_70->m_inputs,(ulong)var._4_4_);
    var_verification = (string *)*ppVVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_1,"",(allocator<char> *)((long)&var_1 + 7));
    getVariableVerifcation
              (&local_b8,this,(string *)&i_1,*(GLvoid **)var_verification,
               (Descriptor *)&var_verification->field_2,(FLAVOUR)si);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&var_1 + 7));
    local_98 = &local_b8;
    pGVar4 = (GLchar *)std::__cxx11::string::c_str();
    Utils::insertElementOfList
              (pGVar4,getVerificationSnippet::separator,&stack0xffffffffffffff80,(string *)local_50)
    ;
    std::__cxx11::string::~string((string *)&local_b8);
    var._4_4_ = var._4_4_ + 1;
  }
  var_1._0_4_ = 0;
  while( true ) {
    uVar2 = (ulong)(uint)var_1;
    sVar1 = std::
            vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ::size(&local_70->m_uniforms);
    if (sVar1 <= uVar2) break;
    ppVVar3 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::operator[](&local_70->m_uniforms,(ulong)(uint)var_1);
    var_verification_1 = (string *)*ppVVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_2,"",(allocator<char> *)((long)&var_2 + 7));
    getVariableVerifcation
              (&local_110,this,(string *)&i_2,*(GLvoid **)var_verification_1,
               (Descriptor *)&var_verification_1->field_2,BASIC);
    std::__cxx11::string::~string((string *)&i_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&var_2 + 7));
    local_f0 = &local_110;
    pGVar4 = (GLchar *)std::__cxx11::string::c_str();
    Utils::insertElementOfList
              (pGVar4,getVerificationSnippet::separator,&stack0xffffffffffffff80,(string *)local_50)
    ;
    std::__cxx11::string::~string((string *)&local_110);
    var_1._0_4_ = (uint)var_1 + 1;
  }
  var_2._0_4_ = 0;
  while( true ) {
    uVar2 = (ulong)(uint)var_2;
    sVar1 = std::
            vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ::size(&local_70->m_ssb_blocks);
    if (sVar1 <= uVar2) break;
    ppVVar3 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::operator[](&local_70->m_ssb_blocks,(ulong)(uint)var_2);
    var_verification_2 = (string *)*ppVVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"",&local_189);
    getVariableVerifcation
              (&local_168,this,&local_188,*(GLvoid **)var_verification_2,
               (Descriptor *)&var_verification_2->field_2,BASIC);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    local_148 = &local_168;
    pGVar4 = (GLchar *)std::__cxx11::string::c_str();
    Utils::insertElementOfList
              (pGVar4,getVerificationSnippet::separator,&stack0xffffffffffffff80,(string *)local_50)
    ;
    std::__cxx11::string::~string((string *)&local_168);
    var_2._0_4_ = (uint)var_2 + 1;
  }
  Utils::endList("",&stack0xffffffffffffff80,(string *)local_50);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_50);
LAB_00e6ae74:
  position._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureTestBase::getVerificationSnippet(GLuint /* test_case_index */,
													Utils::ProgramInterface& program_interface,
													Utils::Shader::STAGES	stage)
{
	static const GLchar* separator = " ||\n        ";

	std::string verification = "if (LIST)\n"
							   "    {\n"
							   "        result = 0u;\n"
							   "    }\n";

	/* Get flavour of in and out variables */
	Utils::Variable::FLAVOUR in_flavour = Utils::Variable::GetFlavour(stage, Utils::Variable::INPUT);

	/* Get interface for shader stage */
	Utils::ShaderInterface& si = program_interface.GetShaderInterface(stage);

	/* There are no varialbes to verify */
	if ((0 == si.m_inputs.size()) && (0 == si.m_uniforms.size()) && (0 == si.m_ssb_blocks.size()))
	{
		return "";
	}

	/* For each in variable insert verification code */
	size_t position = 0;

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		const Utils::Variable& var				= *si.m_inputs[i];
		const std::string&	 var_verification = getVariableVerifcation("", var.m_data, var.m_descriptor, in_flavour);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	/* For each unifrom variable insert verification code */
	for (GLuint i = 0; i < si.m_uniforms.size(); ++i)
	{
		const Utils::Variable& var = *si.m_uniforms[i];
		const std::string&	 var_verification =
			getVariableVerifcation("", var.m_data, var.m_descriptor, Utils::Variable::BASIC);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	/* For each ssb variable insert verification code */
	for (GLuint i = 0; i < si.m_ssb_blocks.size(); ++i)
	{
		const Utils::Variable& var = *si.m_ssb_blocks[i];
		const std::string&	 var_verification =
			getVariableVerifcation("", var.m_data, var.m_descriptor, Utils::Variable::BASIC);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	Utils::endList("", position, verification);

#if DEBUG_TTB_VERIFICATION_SNIPPET_STAGE

	{
		GLchar buffer[16];
		sprintf(buffer, "%d", stage + 10);
		Utils::replaceToken("0u", position, buffer, verification);
	}

#elif DEBUG_TTB_VERIFICATION_SNIPPET_VARIABLE

	if (Utils::Shader::VERTEX == stage)
	{
		Utils::replaceToken("0u", position, "in_vs_first.x", verification);
	}
	else
	{
		Utils::replaceToken("0u", position, "31u", verification);
	}

#endif

	/* Done */
	return verification;
}